

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall inja::Parser::add_to_template_storage(Parser *this,path *path,string *template_name)

{
  uint uVar1;
  int iVar2;
  iterator iVar3;
  FileError *this_00;
  mapped_type *tmpl;
  string text;
  string original_name;
  string local_2f0;
  path local_2d0;
  Template include_template;
  ifstream file;
  uint auStack_210 [50];
  undefined8 auStack_148 [36];
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
          ::find(&this->template_storage->_M_t,template_name);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &(this->template_storage->_M_t)._M_impl.super__Rb_tree_header) {
    return;
  }
  ::std::__cxx11::string::string((string *)&original_name,(string *)template_name);
  if (this->config->search_included_templates_in_files == true) {
    ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&include_template,&original_name,auto_format);
    std::filesystem::__cxx11::operator/((path *)&file,path,(path *)&include_template);
    std::filesystem::__cxx11::path::string(&text,(path *)&file);
    ::std::__cxx11::string::operator=((string *)template_name,(string *)&text);
    ::std::__cxx11::string::~string((string *)&text);
    std::filesystem::__cxx11::path::~path((path *)&file);
    std::filesystem::__cxx11::path::~path((path *)&include_template);
    iVar2 = ::std::__cxx11::string::compare((ulong)template_name,0,(char *)0x2);
    if (iVar2 == 0) {
      ::std::__cxx11::string::erase((ulong)template_name,0);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
            ::find(&this->template_storage->_M_t,template_name);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->template_storage->_M_t)._M_impl.super__Rb_tree_header) {
      ::std::ifstream::ifstream(&file);
      ::std::ifstream::open((string *)&file,(_Ios_Openmode)template_name);
      uVar1 = *(uint *)((long)auStack_210 + *(long *)(_file + -0x18));
      if ((uVar1 & 5) == 0) {
        text._M_dataplus._M_p = (pointer)&text.field_2;
        ::std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                  ((string *)&text,*(undefined8 *)((long)auStack_148 + *(long *)(_file + -0x18)),
                   0xffffffffffffffff,0,0xffffffff);
        ::std::__cxx11::string::string((string *)&local_2f0,(string *)&text);
        Template::Template(&include_template,&local_2f0);
        ::std::__cxx11::string::~string((string *)&local_2f0);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
        ::_M_emplace_unique<std::__cxx11::string&,inja::Template&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                    *)this->template_storage,template_name,&include_template);
        tmpl = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
               ::operator[](this->template_storage,template_name);
        ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_2d0,template_name,auto_format);
        parse_into_template(this,tmpl,&local_2d0);
        std::filesystem::__cxx11::path::~path(&local_2d0);
        Template::~Template(&include_template);
        ::std::__cxx11::string::~string((string *)&text);
      }
      else if ((this->config->include_callback).super__Function_base._M_manager ==
               (_Manager_type)0x0) {
        this_00 = (FileError *)__cxa_allocate_exception(0x60);
        ::std::operator+(&text,"failed accessing file at \'",template_name);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &include_template,&text,"\'");
        FileError::FileError(this_00,(string *)&include_template);
        __cxa_throw(this_00,&FileError::typeinfo,InjaError::~InjaError);
      }
      ::std::ifstream::~ifstream(&file);
      if ((uVar1 & 5) == 0) goto LAB_0014a994;
    }
  }
  if ((this->config->include_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<inja::Template_(const_std::filesystem::__cxx11::path_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((Template *)&file,&this->config->include_callback,path,&original_name);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
    ::_M_emplace_unique<std::__cxx11::string&,inja::Template&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                *)this->template_storage,template_name,(Template *)&file);
    Template::~Template((Template *)&file);
  }
LAB_0014a994:
  ::std::__cxx11::string::~string((string *)&original_name);
  return;
}

Assistant:

void add_to_template_storage(const std::filesystem::path& path, std::string& template_name) {
    if (template_storage.find(template_name) != template_storage.end()) {
      return;
    }

    const std::string original_name = template_name;

    if (config.search_included_templates_in_files) {
      // Build the relative path
      template_name = (path / original_name).string();
      if (template_name.compare(0, 2, "./") == 0) {
        template_name.erase(0, 2);
      }

      if (template_storage.find(template_name) == template_storage.end()) {
        // Load file
        std::ifstream file;
        file.open(template_name);
        if (!file.fail()) {
          const std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());

          auto include_template = Template(text);
          template_storage.emplace(template_name, include_template);
          parse_into_template(template_storage[template_name], template_name);
          return;
        } else if (!config.include_callback) {
          INJA_THROW(FileError("failed accessing file at '" + template_name + "'"));
        }
      }
    }

    // Try include callback
    if (config.include_callback) {
      auto include_template = config.include_callback(path, original_name);
      template_storage.emplace(template_name, include_template);
    }
  }